

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void character_sits(tgestate_t *state,uint8_t routeindex,route_t *route)

{
  byte bVar1;
  undefined8 in_RDX;
  room_t room_00;
  char in_SIL;
  room_t room;
  int offset;
  int room_index;
  uint8_t index;
  int in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 uVar3;
  undefined7 in_stack_fffffffffffffff0;
  
  room_00 = (room_t)((ulong)in_RDX >> 0x38);
  bVar1 = in_SIL - 0x12;
  uVar2 = 0x19;
  if (2 < bVar1) {
    uVar2 = 0x17;
    bVar1 = in_SIL - 0x15;
  }
  uVar3 = CONCAT13(bVar1,in_stack_ffffffffffffffe4);
  set_roomdef((tgestate_t *)CONCAT44(uVar3,uVar2),'\0',in_stack_ffffffffffffffd8,0);
  character_sit_sleep_common
            ((tgestate_t *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),room_00,
             (route_t *)CONCAT44(uVar3,uVar2));
  return;
}

Assistant:

void character_sits(tgestate_t *state,
                    uint8_t     routeindex,
                    route_t    *route)
{
  uint8_t  index;      /* was A */
  int      room_index; /* Conv: new */
  int      offset;     /* Conv: new */
  room_t   room;       /* was C */

  assert(state  != NULL);
  assert(routeindex >= routeindex_18_PRISONER_SITS_1 &&
         routeindex <= routeindex_23_PRISONER_SITS_3);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  index = routeindex - routeindex_18_PRISONER_SITS_1;
  /* First three characters. */
  room_index = room_25_MESS_HALL;
  offset     = roomdef_25_BENCH_D;
  if (index >= 3)
  {
    /* Last two characters. */
    room_index = room_23_MESS_HALL;
    offset     = roomdef_23_BENCH_A;
    index -= 3;
  }
  set_roomdef(state,
              room_index,
              offset + index * 3,
              interiorobject_PRISONER_SAT_MID_TABLE);

  if (routeindex < routeindex_21_PRISONER_SITS_1)
    room = room_25_MESS_HALL;
  else
    room = room_23_MESS_HALL;

  character_sit_sleep_common(state, room, route);
}